

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_open1(archive *_a)

{
  int iVar1;
  void *pvVar2;
  uint local_3c;
  int magic_test;
  uint i;
  int e;
  int slot;
  archive_read_filter *tmp;
  archive_read_filter *filter;
  archive_read *a;
  archive *_a_local;
  
  magic_test = 0;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    archive_clear_error(_a);
    if (_a[1].compression_name == (char *)0x0) {
      archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
      _a->state = 0x8000;
      _a_local._4_4_ = -0x1e;
    }
    else if ((*(long *)&_a[1].compression_code == 0) ||
            (magic_test = (**(code **)&_a[1].compression_code)
                                    (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)),
            magic_test == 0)) {
      pvVar2 = calloc(1,0xb0);
      if (pvVar2 == (void *)0x0) {
        _a_local._4_4_ = -0x1e;
      }
      else {
        *(undefined8 *)((long)pvVar2 + 8) = 0;
        *(undefined8 *)((long)pvVar2 + 0x10) = 0;
        *(archive **)((long)pvVar2 + 0x18) = _a;
        *(undefined8 *)((long)pvVar2 + 0x50) =
             *(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10);
        *(code **)((long)pvVar2 + 0x20) = client_open_proxy;
        *(code **)((long)pvVar2 + 0x28) = client_read_proxy;
        *(code **)((long)pvVar2 + 0x30) = client_skip_proxy;
        *(code **)((long)pvVar2 + 0x38) = client_seek_proxy;
        *(code **)((long)pvVar2 + 0x40) = client_close_proxy;
        *(code **)((long)pvVar2 + 0x48) = client_switch_proxy;
        *(char **)((long)pvVar2 + 0x58) = "none";
        *(undefined4 *)((long)pvVar2 + 0x60) = 0;
        **(undefined8 **)&_a[1].current_codepage = 0;
        if ((_a[6].error_string.length == 0) || ((int)_a[6].error_string.buffer_length == 0)) {
          _a[6].error_string.length = (size_t)pvVar2;
          magic_test = choose_filters((archive_read *)_a);
          if (magic_test < -0x14) {
            _a->state = 0x8000;
            return -0x1e;
          }
        }
        else {
          for (_e = _a[6].error_string.length; *(long *)(_e + 0x10) != 0;
              _e = *(size_t *)(_e + 0x10)) {
          }
          *(void **)(_e + 0x10) = pvVar2;
        }
        if (_a[0xf].error_string.length == 0) {
          iVar1 = choose_format((archive_read *)_a);
          if (iVar1 < 0) {
            __archive_read_close_filters((archive_read *)_a);
            _a->state = 0x8000;
            return -0x1e;
          }
          _a[0xf].error_string.length = (size_t)(&_a[6].sconv + (long)iVar1 * 0xb);
        }
        _a->state = 2;
        client_switch_proxy((archive_read_filter *)_a[6].error_string.length,0);
        _a_local._4_4_ = magic_test;
      }
    }
    else {
      _a_local._4_4_ = magic_test;
      if (_a[1].error_string.s != (char *)0x0) {
        for (local_3c = 0; local_3c < (uint)_a[1].error_string.buffer_length;
            local_3c = local_3c + 1) {
          (*(code *)_a[1].error_string.s)
                    (_a,*(undefined8 *)
                         (*(long *)&_a[1].current_codepage + (ulong)local_3c * 0x18 + 0x10));
        }
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}